

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnMemoryInitExpr
          (ExprVisitorDelegate *this,MemoryInitExpr *expr)

{
  WatWriter *this_00;
  char *s;
  MemoryInitExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::MemoryInit_Opcode);
  WritePutsSpace(this_00,s);
  WriteVar(this->writer_,&expr->var,Space);
  WriteMemoryVarUnlessZero(this->writer_,&(expr->super_MemoryExpr<(wabt::ExprType)32>).memidx,Space)
  ;
  WriteNewline(this->writer_,false);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnMemoryInitExpr(MemoryInitExpr* expr) {
  writer_->WritePutsSpace(Opcode::MemoryInit_Opcode.GetName());
  writer_->WriteVar(expr->var, NextChar::Space);
  writer_->WriteMemoryVarUnlessZero(expr->memidx, NextChar::Space);
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}